

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O3

fio_str_info_s *
fio_str_vprintf(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,char *format,
               __va_list_tag *argv)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  fio_str_info_s *pfVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  undefined4 extraout_var_00;
  ulong uVar9;
  size_t sVar10;
  ulong needed;
  va_list argv_cpy;
  fio_str_info_s local_60;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = argv->reg_save_area;
  local_48._0_4_ = argv->gp_offset;
  local_48._4_4_ = argv->fp_offset;
  pvStack_40 = argv->overflow_arg_area;
  uVar3 = vsnprintf((char *)0x0,0,format,&local_48);
  if ((int)uVar3 < 1) {
    if (s == (fio_str_s_conflict *)0x0) {
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 0;
      __return_storage_ptr__->data = (char *)0x0;
      return (fio_str_info_s *)CONCAT44(extraout_var,uVar3);
    }
    bVar1 = s->small;
    if ((bVar1 == 0) && (pcVar2 = s->data, pcVar2 != (char *)0x0)) {
      if (s->frozen == '\0') {
        uVar6 = s->capa;
      }
      else {
        uVar6 = 0;
      }
      __return_storage_ptr__->capa = uVar6;
      pfVar5 = (fio_str_info_s *)s->len;
      __return_storage_ptr__->len = (size_t)pfVar5;
      __return_storage_ptr__->data = pcVar2;
      return pfVar5;
    }
    sVar10 = 0x2d;
    if (s->frozen != '\0') {
      sVar10 = 0;
    }
    __return_storage_ptr__->capa = sVar10;
    pfVar5 = (fio_str_info_s *)(ulong)(bVar1 >> 1);
    __return_storage_ptr__->len = (size_t)pfVar5;
    __return_storage_ptr__->data = (char *)s->reserved;
    return pfVar5;
  }
  uVar9 = (ulong)uVar3;
  if (s->small == 0) {
    puVar8 = (uint8_t *)s->data;
    if (puVar8 != (uint8_t *)0x0) {
      if (s->frozen == '\0') {
        needed = s->len + uVar9;
        uVar7 = s->capa;
        if (uVar7 <= needed) {
          if (s->dealloc == (_func_void_void_ptr *)0x0) {
            uVar7 = s->len;
          }
          s->len = uVar7;
          goto LAB_00144cd4;
        }
        goto LAB_00144cdd;
      }
      __return_storage_ptr__->capa = 0;
      needed = s->len;
      __return_storage_ptr__->len = needed;
LAB_00144cf8:
      __return_storage_ptr__->data = (char *)puVar8;
      goto LAB_00144cfc;
    }
    needed = uVar9;
    if (s->frozen == '\0') goto LAB_00144c17;
    needed = 0;
LAB_00144b98:
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = needed;
  }
  else {
    needed = (ulong)(s->small >> 1);
    if (s->frozen != '\0') goto LAB_00144b98;
    needed = needed + uVar9;
LAB_00144c17:
    if (0x2d < needed) {
      s->small = '[';
LAB_00144cd4:
      fio_str_capa_assert(&local_60,s,needed);
LAB_00144cdd:
      s->len = needed;
      s->data[needed] = '\0';
      __return_storage_ptr__->capa = s->capa;
      __return_storage_ptr__->len = needed;
      puVar8 = (uint8_t *)s->data;
      goto LAB_00144cf8;
    }
    s->small = (char)needed * '\x02' + '\x01';
    s->reserved[needed] = '\0';
    __return_storage_ptr__->capa = 0x2d;
    __return_storage_ptr__->len = needed;
  }
  puVar8 = s->reserved;
  __return_storage_ptr__->data = (char *)puVar8;
LAB_00144cfc:
  iVar4 = vsnprintf((char *)(puVar8 + (needed - uVar9)),(ulong)(uVar3 + 1),format,argv);
  return (fio_str_info_s *)CONCAT44(extraout_var_00,iVar4);
}

Assistant:

FIO_FUNC __attribute__((format(printf, 2, 0))) fio_str_info_s
fio_str_vprintf(fio_str_s *s, const char *format, va_list argv) {
  va_list argv_cpy;
  va_copy(argv_cpy, argv);
  int len = vsnprintf(NULL, 0, format, argv_cpy);
  va_end(argv_cpy);
  if (len <= 0)
    return fio_str_info(s);
  fio_str_info_s state = fio_str_resize(s, len + fio_str_len(s));
  vsnprintf(state.data + (state.len - len), len + 1, format, argv);
  return state;
}